

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<long_long,int,7>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (longlong *lhs,int *rhs,longlong *result)

{
  long lVar1;
  long *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int64_t tmp;
  
  lVar1 = *in_RDI - (long)*in_RSI;
  if ((((*in_RDI < 0) || (-1 < *in_RSI)) || (*in_RDI <= lVar1)) &&
     ((*in_RSI < 0 || (lVar1 <= *in_RDI)))) {
    *in_RDX = lVar1;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::int64_t, rhs signed (up to 64-bit)
        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        // Note - ideally, we can order these so that true conditionals
        // lead to success, which enables better pipelining
        // It isn't practical here
        if( ( lhs >= 0 && rhs < 0 && tmp < lhs ) || // condition 2
            ( rhs >= 0 && tmp > lhs ) )             // condition 3
        {
            E::SafeIntOnOverflow();
        }

        result = (T)tmp;
    }